

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
FeatureResolverPoolTest_CompileDefaultsInvalidDefaultsScalarParsingError_Test::
FeatureResolverPoolTest_CompileDefaultsInvalidDefaultsScalarParsingError_Test
          (FeatureResolverPoolTest_CompileDefaultsInvalidDefaultsScalarParsingError_Test *this)

{
  FeatureResolverPoolTest_CompileDefaultsInvalidDefaultsScalarParsingError_Test *this_local;
  
  FeatureResolverPoolTest::FeatureResolverPoolTest(&this->super_FeatureResolverPoolTest);
  (this->super_FeatureResolverPoolTest).super_Test._vptr_Test =
       (_func_int **)
       &PTR__FeatureResolverPoolTest_CompileDefaultsInvalidDefaultsScalarParsingError_Test_029c4ef0;
  return;
}

Assistant:

TEST_F(FeatureResolverPoolTest,
       CompileDefaultsInvalidDefaultsScalarParsingError) {
  const FileDescriptor* file = ParseSchema(R"schema(
    syntax = "proto2";
    package test;
    import "google/protobuf/descriptor.proto";

    extend google.protobuf.FeatureSet {
      optional Foo bar = 9999;
    }
    message Foo {
      optional bool field_feature = 12 [
        targets = TARGET_TYPE_FIELD,
        feature_support.edition_introduced = EDITION_2023,
        edition_defaults = { edition: EDITION_LEGACY, value: "1.23" }
      ];
    }
  )schema");
  ASSERT_NE(file, nullptr);

  const FieldDescriptor* ext = file->extension(0);
  EXPECT_THAT(
      FeatureResolver::CompileDefaults(feature_set_, {ext}, EDITION_2023,
                                       EDITION_2023),
      HasError(AllOf(HasSubstr("in edition_defaults"), HasSubstr("1.23"))));
}